

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestSpec::NamePattern::~NamePattern(NamePattern *this)

{
  (this->super_Pattern).super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__NamePattern_00177568;
  std::__cxx11::string::~string((string *)&this->m_name);
  return;
}

Assistant:

TestSpec::NamePattern::~NamePattern() {}